

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

void hmac_apply_key(st_picotls_hmac_context_t *ctx,uint8_t pad)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  puVar1 = ctx->key;
  for (sVar2 = 0; sVar2 != ctx->algo->block_size; sVar2 = sVar2 + 1) {
    puVar1[sVar2] = puVar1[sVar2] ^ pad;
  }
  (*ctx->hash->update)(ctx->hash,puVar1,sVar2);
  for (sVar2 = 0; sVar2 != ctx->algo->block_size; sVar2 = sVar2 + 1) {
    puVar1[sVar2] = puVar1[sVar2] ^ pad;
  }
  return;
}

Assistant:

static void hmac_apply_key(struct st_picotls_hmac_context_t *ctx, uint8_t pad)
{
    size_t i;

    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
    ctx->hash->update(ctx->hash, ctx->key, ctx->algo->block_size);
    for (i = 0; i != ctx->algo->block_size; ++i)
        ctx->key[i] ^= pad;
}